

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scene.cpp
# Opt level: O1

char * get_gl_err_str(GLenum err)

{
  switch(err) {
  case 0x500:
    return "Invalid enum";
  case 0x501:
    return "Invalid value";
  case 0x502:
    return "Invalid operation";
  case 0x503:
    return "Stack overflow";
  case 0x504:
    return "Stack underflow";
  case 0x505:
    return "Out of memory";
  }
  if (err != 0) {
    return "Unknown error";
  }
  return "No error";
}

Assistant:

const char * get_gl_err_str(GLenum err) {
    switch (err) {
        case GL_NO_ERROR:
            return "No error";
        case GL_INVALID_ENUM:
            return "Invalid enum";
        case GL_INVALID_VALUE:
            return "Invalid value";
        case GL_INVALID_OPERATION:
            return "Invalid operation";
        case GL_STACK_OVERFLOW:
            return "Stack overflow";
        case GL_STACK_UNDERFLOW:
            return "Stack underflow";
        case GL_OUT_OF_MEMORY:
            return "Out of memory";
        default:
            return "Unknown error";
    }
}